

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting.hpp
# Opt level: O1

double ising::counting::free_energy<lattice::graph>(double beta,graph *lat,double J,double H)

{
  size_type __n;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  allocator_type local_51;
  double local_50;
  double local_48;
  vector<double,_std::allocator<double>_> local_40;
  vector<double,_std::allocator<double>_> local_28;
  double local_10;
  
  local_50 = beta;
  local_48 = H;
  local_10 = J;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_28,
             ((long)(lat->bonds_).
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(lat->bonds_).
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,&local_10,
             (allocator_type *)&local_40);
  if ((local_48 != 0.0) || (NAN(local_48))) {
    __n = ((long)(lat->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(lat->sites_).
                 super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  }
  else {
    __n = 0;
  }
  std::vector<double,_std::allocator<double>_>::vector(&local_40,__n,&local_48,&local_51);
  local_50 = free_energy<lattice::graph>(local_50,lat,&local_28,&local_40);
  if (local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_40.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return local_50;
}

Assistant:

static double free_energy(double beta, LATTICE const& lat, double J, double H = 0.0) {
    std::vector<double> inter(lat.num_bonds(), J);
    std::vector<double> field((H != 0.0) ? lat.num_sites() : 0, H);
    return free_energy(beta, lat, inter, field);
  }